

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ArgMaxLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_argmax(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ArgMaxLayerParams *pAVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_argmax(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_argmax(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pAVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ArgMaxLayerParams>(arena);
    (this->layer_).argmax_ = pAVar2;
  }
  return (ArgMaxLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgMaxLayerParams* NeuralNetworkLayer::_internal_mutable_argmax() {
  if (!_internal_has_argmax()) {
    clear_layer();
    set_has_argmax();
    layer_.argmax_ = CreateMaybeMessage< ::CoreML::Specification::ArgMaxLayerParams >(GetArenaForAllocation());
  }
  return layer_.argmax_;
}